

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_texture.c
# Opt level: O1

bool_t prf_vertex_with_texture_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  float64_t *pfVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  uint len;
  bool_t bVar5;
  uint uVar6;
  float32_t fVar7;
  float64_t fVar8;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_vertex_with_texture_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if (uVar2 < 0x20) {
      prf_error(6,"vertex with texture too short (%d bytes) - not supported");
      return 0;
    }
    if (node->data == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar4 = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        puVar4 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = puVar4;
      if (puVar4 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar6 = 8;
        goto LAB_0010b239;
      }
    }
    pfVar1 = (float64_t *)node->data;
    uVar2 = bf_get_uint16_be(bfile);
    *(uint16_t *)(pfVar1 + 3) = uVar2;
    uVar2 = bf_get_uint16_be(bfile);
    *(uint16_t *)((long)pfVar1 + 0x1a) = uVar2;
    fVar8 = bf_get_float64_be(bfile);
    *pfVar1 = fVar8;
    fVar8 = bf_get_float64_be(bfile);
    pfVar1[1] = fVar8;
    fVar8 = bf_get_float64_be(bfile);
    pfVar1[2] = fVar8;
    uVar6 = 0x20;
    if (0x23 < node->length) {
      fVar7 = bf_get_float32_be(bfile);
      *(float32_t *)((long)pfVar1 + 0x1c) = fVar7;
      uVar6 = 0x24;
      if (0x27 < node->length) {
        fVar7 = bf_get_float32_be(bfile);
        *(float32_t *)(pfVar1 + 4) = fVar7;
        uVar6 = 0x28;
        if (0x2b < node->length) {
          uVar3 = bf_get_uint32_be(bfile);
          *(uint32_t *)((long)pfVar1 + 0x24) = uVar3;
          uVar6 = 0x2c;
          if (0x2f < node->length) {
            uVar3 = bf_get_uint32_be(bfile);
            *(uint32_t *)(pfVar1 + 5) = uVar3;
            uVar6 = 0x30;
          }
        }
      }
    }
    bVar5 = 1;
    len = node->length - uVar6;
    if (uVar6 <= node->length && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar6 - 4),len);
    }
  }
  else {
    prf_error(9,"tried vertex with texture load method for node of type %d",(ulong)uVar2);
    uVar6 = 2;
LAB_0010b239:
    bVar5 = 0;
    bf_rewind(bfile,uVar6);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_vertex_with_texture_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_with_texture_info.opcode ) {
        prf_error( 9,
            "tried vertex with texture load method for node of type %d",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 32 ) {
        prf_error( 6,
            "vertex with texture too short (%d bytes) - not supported",
            node->length );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 8 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        data->color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->flags = bf_get_uint16_be( bfile ); pos += 2;
        prf_dblwrite( data->x, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->y, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->z, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        data->texture[0] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->texture[1] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->color_index = bf_get_uint32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}